

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fossilize_db.cpp
# Opt level: O0

bool __thiscall
Fossilize::DatabaseInterface::Impl::parse_imported_metadata(Impl *this,void *data_,size_t size_)

{
  ExportedMetadataList *pEVar1;
  ExportedMetadataList *pEVar2;
  ExportedMetadataList *list;
  ExportedMetadataList *__end2;
  ExportedMetadataList *__begin2;
  ExportedMetadataList (*__range2) [10];
  ExportedMetadataHeader *header;
  ExportedMetadataHeader *concurrent_header;
  ulong local_50;
  size_t size;
  uint8_t *data;
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  headers;
  size_t size__local;
  void *data__local;
  Impl *this_local;
  
  headers.
  super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ._M_impl.super__Vector_impl_data._M_end_of_storage = (pointer)size_;
  std::
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ::vector((vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
            *)&data);
  size = (size_t)data_;
  local_50 = deduce_imported_size
                       (data_,(size_t)headers.
                                      super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                                      ._M_impl.super__Vector_impl_data._M_end_of_storage);
  if (local_50 < 0xb0) {
    this_local._7_1_ = false;
  }
  else {
    header = (ExportedMetadataHeader *)size;
    if (*(long *)size == 0xb10b5f05511153) {
      local_50 = local_50 - *(long *)(size + 8);
      size = *(long *)(size + 8) + size;
    }
    else {
      header = (ExportedMetadataHeader *)0x0;
    }
    while (local_50 != 0) {
      if (local_50 < 0xb0) {
        this_local._7_1_ = false;
        goto LAB_001aaa70;
      }
      __range2 = (ExportedMetadataList (*) [10])size;
      if (*(long *)size != 0xb10bf05511153) {
        this_local._7_1_ = false;
        goto LAB_001aaa70;
      }
      if (local_50 < *(ulong *)(size + 8)) {
        this_local._7_1_ = false;
        goto LAB_001aaa70;
      }
      pEVar1 = (ExportedMetadataList *)size;
      while (__end2 = pEVar1 + 1, __end2 != (ExportedMetadataList *)(size + 0xb0)) {
        pEVar2 = pEVar1 + 1;
        pEVar1 = __end2;
        if (local_50 < __end2->offset + pEVar2->count * 0x20) {
          this_local._7_1_ = false;
          goto LAB_001aaa70;
        }
      }
      local_50 = local_50 - *(long *)(size + 8);
      size = *(long *)(size + 8) + size;
      std::
      vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
      ::push_back((vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                   *)&data,(value_type *)&__range2);
    }
    if (this->mapped_metadata != (uint8_t *)0x0) {
      munmap(this->mapped_metadata,this->mapped_metadata_size);
    }
    this->mapped_metadata = (uint8_t *)data_;
    this->mapped_metadata_size =
         (size_t)headers.
                 super__Vector_base<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                 ._M_impl.super__Vector_impl_data._M_end_of_storage;
    std::
    vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
    ::operator=(&this->imported_metadata,
                (vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
                 *)&data);
    this->imported_concurrent_metadata = header;
    this_local._7_1_ = true;
  }
LAB_001aaa70:
  concurrent_header._4_4_ = 1;
  std::
  vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
  ::~vector((vector<const_Fossilize::ExportedMetadataHeader_*,_std::allocator<const_Fossilize::ExportedMetadataHeader_*>_>
             *)&data);
  return this_local._7_1_;
}

Assistant:

bool DatabaseInterface::Impl::parse_imported_metadata(const void *data_, size_t size_)
{
	std::vector<const ExportedMetadataHeader *> headers;
	auto *data = static_cast<const uint8_t *>(data_);

	// Imported size might be rounded up to page size, so find exact bound first.
	size_t size = deduce_imported_size(data_, size_);

	if (size < sizeof(ExportedMetadataHeader))
		return false;

	auto *concurrent_header = reinterpret_cast<const ExportedMetadataHeader *>(data);
	if (concurrent_header->magic == ExportedMetadataMagicConcurrent)
	{
		data += concurrent_header->size;
		size -= concurrent_header->size;
	}
	else
		concurrent_header = nullptr;

	while (size != 0)
	{
		if (size < sizeof(ExportedMetadataHeader))
			return false;

		auto *header = reinterpret_cast<const ExportedMetadataHeader *>(data);
		if (header->magic != ExportedMetadataMagic)
			return false;
		if (header->size > size)
			return false;

		for (auto &list : header->lists)
			if (list.offset + list.count * sizeof(ExportedMetadataBlock) > size)
				return false;

		data += header->size;
		size -= header->size;
		headers.push_back(header);
	}

#ifdef _WIN32
	if (mapped_metadata)
		UnmapViewOfFile(mapped_metadata);
#else
	if (mapped_metadata)
		munmap(const_cast<uint8_t *>(mapped_metadata), mapped_metadata_size);
#endif
	mapped_metadata = static_cast<const uint8_t *>(data_);
	mapped_metadata_size = size_;
	imported_metadata = std::move(headers);
	imported_concurrent_metadata = concurrent_header;
	return true;
}